

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyObj.c
# Opt level: O2

void Ivy_ObjPatchFanin0(Ivy_Man_t *p,Ivy_Obj_t *pObj,Ivy_Obj_t *pFaninNew)

{
  int *piVar1;
  Ivy_Obj_t *pObj_00;
  bool bVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyObj.c"
                  ,0xe3,"void Ivy_ObjPatchFanin0(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  pObj_00 = (Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  Ivy_ObjRefsDec(pObj_00);
  if (p->fFanout == 0) {
    bVar2 = true;
  }
  else {
    Ivy_ObjDeleteFanout(p,pObj_00,pObj);
    bVar2 = p->fFanout == 0;
  }
  pObj->pFanin0 = pFaninNew;
  piVar1 = &((Ivy_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe))->nRefs;
  *piVar1 = *piVar1 + 1;
  if (!bVar2) {
    Ivy_ObjAddFanout(p,(Ivy_Obj_t *)((ulong)pFaninNew & 0xfffffffffffffffe),pObj);
  }
  if ((((*(uint *)&pObj_00->field_0x8 & 0xf) != 1) && (pObj_00->Id != 0)) && (pObj_00->nRefs == 0))
  {
    Ivy_ObjDelete_rec(p,pObj_00,1);
    return;
  }
  return;
}

Assistant:

void Ivy_ObjPatchFanin0( Ivy_Man_t * p, Ivy_Obj_t * pObj, Ivy_Obj_t * pFaninNew )
{
    Ivy_Obj_t * pFaninOld;
    assert( !Ivy_IsComplement(pObj) );
    pFaninOld = Ivy_ObjFanin0(pObj);
    // decrement ref and remove fanout
    Ivy_ObjRefsDec( pFaninOld );
    if ( p->fFanout )
        Ivy_ObjDeleteFanout( p, pFaninOld, pObj );
    // update the fanin
    pObj->pFanin0 = pFaninNew;
    // increment ref and add fanout
    Ivy_ObjRefsInc( Ivy_Regular(pFaninNew) );
    if ( p->fFanout )
        Ivy_ObjAddFanout( p, Ivy_Regular(pFaninNew), pObj );
    // get rid of old fanin
    if ( !Ivy_ObjIsPi(pFaninOld) && !Ivy_ObjIsConst1(pFaninOld) && Ivy_ObjRefs(pFaninOld) == 0 )
        Ivy_ObjDelete_rec( p, pFaninOld, 1 );
}